

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

bool is_wielded(CHAR_DATA *ch,int weapon,int type)

{
  OBJ_DATA *pOVar1;
  
  pOVar1 = get_eq_char(ch,0x10);
  if (pOVar1 == (OBJ_DATA *)0x0) {
    if ((weapon == 10) && (pOVar1 = get_eq_char(ch,0x12), pOVar1 == (OBJ_DATA *)0x0)) {
      return true;
    }
  }
  else {
    if (pOVar1->value[0] == weapon) {
      if ((type & 0xfffffffdU) == 1) {
        return true;
      }
    }
    else if (type == 3) {
      return false;
    }
    pOVar1 = get_eq_char(ch,0x12);
    if (pOVar1 != (OBJ_DATA *)0x0) {
      return pOVar1->value[0] == weapon;
    }
  }
  return false;
}

Assistant:

bool is_wielded(CHAR_DATA *ch, int weapon, int type)
{

	OBJ_DATA *wield;
	bool primary = false;

	wield = get_eq_char(ch, WEAR_WIELD);
	if (wield == nullptr)
	{
		if (weapon == WEAPON_HAND && (get_eq_char(ch, WEAR_DUAL_WIELD) == nullptr))
			return true;
		else
			return false;
	}

	if (wield->value[0] == weapon)
	{
		if (type == WIELD_ONE || type == WIELD_PRIMARY)
			return true;

		primary = false;
	}
	else
	{
		if (type == WIELD_PRIMARY)
			return false;
	}

	wield = get_eq_char(ch, WEAR_DUAL_WIELD);
	if (wield == nullptr)
	{
		return false;
	}
	if (wield->value[0] == weapon)
	{
		if (type == WIELD_TWO && primary)
			return true;
	}
	else
	{
		return false;
	}

	return true;
}